

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O3

void __thiscall
imrt::Station::Station
          (Station *this,Collimator *collimator,
          vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int _angle,int max_apertures,
          int max_intensity,int initial_intensity,int step_intensity,int open_apertures,int setup,
          fstream *myfile)

{
  _Rb_tree_header *p_Var1;
  pointer pVVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pVVar7;
  Matrix *pMVar8;
  mapped_type *ppMVar9;
  int j;
  long lVar10;
  int i;
  long lVar11;
  ulong uVar12;
  int i_1;
  uint uVar13;
  int a;
  Matrix local_78;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  *local_68;
  int local_5c;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  Matrix *local_48;
  map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
  *local_40;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *local_38;
  
  this->_vptr_Station = (_func_int **)&PTR__Station_0013bbe8;
  this->angle = _angle;
  local_40 = &this->D;
  p_Var1 = &(this->D)._M_t._M_impl.super__Rb_tree_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->D)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->max_apertures = max_apertures;
  this->max_intensity = max_intensity;
  this->initial_intensity = initial_intensity;
  this->step_intensity = step_intensity;
  local_68 = &this->A;
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(local_68,(long)max_apertures,(allocator_type *)&local_78);
  (this->last_mem).first.first = 0;
  (this->last_mem).first.second = 0;
  (this->last_mem).second.first = 0;
  (this->last_mem).second.second = 0;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->last_diff;
  local_50 = &this->last_intensity;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->last_intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->collimator = collimator;
  local_48 = &this->I;
  maths::Matrix::Matrix(local_48);
  local_58 = &this->intensity;
  std::vector<double,_std::allocator<double>_>::vector
            (local_58,(long)max_apertures,(allocator_type *)&local_78);
  p_Var1 = &(this->pos2beam)._M_t._M_impl.super__Rb_tree_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->pos2beam)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->beam2pos)._M_t._M_impl.super__Rb_tree_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->beam2pos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->int2nb)._M_t._M_impl.super__Rb_tree_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->int2nb)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->min_intensity = 1;
  if (open_apertures != -1) {
    max_apertures = open_apertures;
  }
  pVVar7 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  this->n_volumes = (int)((ulong)((long)pVVar2 - (long)pVVar7) >> 6);
  local_78.rows_ = 0;
  local_5c = max_apertures;
  if (pVVar2 != pVVar7) {
    uVar12 = 0;
    do {
      pMVar8 = Volume::getDepositionMatrix(pVVar7 + uVar12,this->angle);
      ppMVar9 = std::
                map<int,_const_maths::Matrix_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_maths::Matrix_*>_>_>
                ::operator[](local_40,&local_78.rows_);
      *ppMVar9 = pMVar8;
      uVar12 = (long)local_78.rows_ + 1;
      local_78.rows_ = (int)uVar12;
      pVVar7 = (volumes->super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(volumes->
                                    super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar7 >> 6))
    ;
  }
  iVar4 = Collimator::getXdim(collimator);
  iVar5 = Collimator::getYdim(collimator);
  maths::Matrix::Matrix(&local_78,iVar4,iVar5);
  maths::Matrix::operator=(local_48,&local_78);
  maths::Matrix::~Matrix(&local_78);
  lVar11 = 0;
  while( true ) {
    iVar4 = Collimator::getXdim(collimator);
    if (iVar4 <= lVar11) break;
    lVar10 = 0;
    while( true ) {
      iVar4 = Collimator::getYdim(collimator);
      if (iVar4 <= lVar10) break;
      bVar3 = Collimator::isActiveBeamAngle(collimator,(int)lVar11,(int)lVar10,this->angle);
      uVar13 = 0;
      if (!bVar3) {
        uVar13 = 0xbff00000;
      }
      (this->I).p[lVar11][lVar10] = (double)((ulong)uVar13 << 0x20);
      lVar10 = lVar10 + 1;
    }
    lVar11 = lVar11 + 1;
  }
  local_38 = &this->last_mem;
  initializeStation(this,setup,local_5c);
  if (myfile != (fstream *)0x0) {
    iVar4 = 0;
    while( true ) {
      iVar5 = Collimator::getXdim(collimator);
      if (iVar5 <= iVar4) break;
      iVar5 = 0;
      while( true ) {
        iVar6 = Collimator::getYdim(collimator);
        if (iVar6 <= iVar5) break;
        std::istream::operator>>((istream *)myfile,&local_78.rows_);
        if (local_78.rows_ != -1) {
          change_intensity(this,iVar4,iVar5,(double)local_78.rows_,
                           (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                           )0x0);
        }
        iVar5 = iVar5 + 1;
      }
      iVar4 = iVar4 + 1;
    }
  }
  (local_38->first).first = -1;
  (local_38->first).second = -1;
  (local_38->second).first = -1;
  (local_38->second).second = -1;
  std::vector<double,_std::allocator<double>_>::operator=(local_50,local_58);
  return;
}

Assistant:

Station::Station(Collimator& collimator, vector<Volume>& volumes, int _angle, int max_apertures,
                   int max_intensity, int initial_intensity, int step_intensity, int open_apertures, int setup, fstream* myfile):
		collimator(collimator), angle(_angle) , max_apertures(max_apertures), A(max_apertures),
		intensity(max_apertures), max_intensity(max_intensity), initial_intensity(initial_intensity),
                step_intensity(step_intensity) {
    
    min_intensity=1;
    if(open_apertures==-1) open_apertures=max_apertures;

    n_volumes=volumes.size();
    for (int i=0; i<volumes.size(); i++)
      D[i]=&volumes[i].getDepositionMatrix(angle);

    // Initialize empty matrix of intensity
    I = Matrix (collimator.getXdim(), collimator.getYdim());
    for (int i=0; i<collimator.getXdim(); i++) {
      for (int j=0; j<collimator.getYdim(); j++) {
        if (collimator.isActiveBeamAngle(i,j,angle)) {
          I(i,j)=0;
        } else {
          I(i,j)=-1;
        }
      }
    }

    // Iniatialize apertures (alternative representation)
    initializeStation(setup, open_apertures);

    if(myfile) {
    	for (int i=0; i<collimator.getXdim(); i++) {
    	   for (int j=0; j<collimator.getYdim(); j++) {
    		   int a; *myfile>>a;
    		   if(a!=-1) change_intensity(i, j, a);
    	   }
    	}
    }

    last_mem= make_pair(make_pair(-1,-1), make_pair(-1,-1));
    last_intensity = intensity; 
  }